

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

wstring * __thiscall
PDA::Transducer::Register::toString_abi_cxx11_(wstring *__return_storage_ptr__,Register *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  ushort uVar2;
  ulong uVar3;
  wstring *pwVar4;
  undefined **ppuVar5;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_68;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  if (this->integer != true) goto switchD_0012e219_default;
  uVar2 = this->argumentIndex;
  if (uVar2 < 0x50) {
    switch(uVar2) {
    case 0:
      uVar3 = (ulong)this->size;
      if (3 < uVar3) goto switchD_0012e219_default;
      ppuVar5 = &PTR_anon_var_dwarf_de473_0014eca0;
      break;
    case 1:
      uVar3 = (ulong)this->size;
      if (3 < uVar3) goto switchD_0012e219_default;
      ppuVar5 = &PTR_anon_var_dwarf_de4a3_0014ecc0;
      break;
    case 2:
      uVar3 = (ulong)this->size;
      if (3 < uVar3) goto switchD_0012e219_default;
      ppuVar5 = &PTR_anon_var_dwarf_de4d3_0014ece0;
      break;
    case 3:
      uVar3 = (ulong)this->size;
      if (3 < uVar3) goto switchD_0012e219_default;
      ppuVar5 = &PTR_anon_var_dwarf_de503_0014ed00;
      break;
    case 4:
      uVar3 = (ulong)this->size;
      if (3 < uVar3) goto switchD_0012e219_default;
      ppuVar5 = &PTR_anon_var_dwarf_de533_0014ed20;
      break;
    case 5:
      uVar3 = (ulong)this->size;
      if (3 < uVar3) goto switchD_0012e219_default;
      ppuVar5 = &PTR_anon_var_dwarf_de563_0014ed40;
      break;
    default:
      goto switchD_0012e219_default;
    }
  }
  else if (uVar2 == 0x52) {
    uVar3 = (ulong)this->size;
    if (3 < uVar3) goto switchD_0012e219_default;
    ppuVar5 = &PTR_anon_var_dwarf_de443_0014ec80;
  }
  else if (uVar2 == 0x51) {
    uVar3 = (ulong)this->size;
    if (3 < uVar3) goto switchD_0012e219_default;
    ppuVar5 = &PTR_anon_var_dwarf_de413_0014ec60;
  }
  else {
    if ((uVar2 != 0x50) || (uVar3 = (ulong)this->size, 3 < uVar3)) goto switchD_0012e219_default;
    ppuVar5 = &PTR_anon_var_dwarf_de3e3_0014ed60;
  }
  std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wchar_t *)ppuVar5[uVar3]);
switchD_0012e219_default:
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::operator+(&local_48,L'%',__return_storage_ptr__);
    std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_48);
    paVar1 = &local_48.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
    }
    if (this->isPtr == true) {
      std::operator+(&local_68,L'(',__return_storage_ptr__);
      pwVar4 = (wstring *)
               std::__cxx11::wstring::_M_replace_aux
                         ((ulong)&local_68,local_68._M_string_length,0,L'\x01');
      std::__cxx11::wstring::wstring((wstring *)&local_48,pwVar4);
      std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 4 + 4);
      }
      if (this->ptrOffset != 0) {
        __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>(&local_68,vswprintf,0x10,L"%d");
        pwVar4 = (wstring *)
                 std::__cxx11::wstring::_M_append
                           ((wchar_t *)&local_68,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
        std::__cxx11::wstring::wstring((wstring *)&local_48,pwVar4);
        std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_48._M_dataplus._M_p != paVar1) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 4 + 4);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring Register::toString() const
{
    // rdi rsi rdx rcx r8 r9 || xmm0-7
    std::wstring result;
    if (integer)
    {
        switch(argumentIndex)
        {
        case ReturnType:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rax";
                break; case Size::Half:
                result = L"eax";
                break; case Size::Quarter:
                result = L"ax";
                break; case Size::OneEight:
                result = L"al";
            }
            break;
        }
        case StackBase:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rbp";
                break; case Size::Half:
                result = L"ebp";
                break; case Size::Quarter:
                result = L"bp";
                break; case Size::OneEight:
                result = L"bpl";
            }
            break;
        }
        case StackTop:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rsp";
                break; case Size::Half:
                result = L"esp";
                break; case Size::Quarter:
                result = L"sp";
                break; case Size::OneEight:
                result = L"spl";
            }
            break;
        }
        case 0:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rdi";
                break; case Size::Half:
                result = L"edi";
                break; case Size::Quarter:
                result = L"di";
                break; case Size::OneEight:
                result = L"dil";
            }
            break;
        }
        case 1:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rsi";
                break; case Size::Half:
                result = L"esi";
                break; case Size::Quarter:
                result = L"si";
                break; case Size::OneEight:
                result = L"sil";
            }
            break;
        }
        case 2:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rdx";
                break; case Size::Half:
                result = L"edx";
                break; case Size::Quarter:
                result = L"dx";
                break; case Size::OneEight:
                result = L"dl";
            }
            break;
        }
        case 3:
        {
            switch(size)
            {
            case Size::Full:
                result = L"rcx";
                break; case Size::Half:
                result = L"ecx";
                break; case Size::Quarter:
                result = L"cx";
                break; case Size::OneEight:
                result = L"cl";
            }
            break;
        }
        case 4:
        {
            switch(size)
            {
            case Size::Full:
                result = L"r8";
                break; case Size::Half:
                result = L"r8d";
                break; case Size::Quarter:
                result = L"r8w";
                break; case Size::OneEight:
                result = L"r8b";
            }
            break;
        }
        case 5:
        {
            switch(size)
            {
            case Size::Full:
                result = L"r9";
                break; case Size::Half:
                result = L"r9d";
                break; case Size::Quarter:
                result = L"r9w";
                break; case Size::OneEight:
                result = L"r9b";
            }
            break;
        }
        }
    }

    if (!result.empty())
    {
        result = L'%' + result;
        if (isPtr)
        {
            result = L'(' + result + L')';
            if (ptrOffset != 0)
                result = std::to_wstring(ptrOffset) + result;
        }
    }

    return result;
}